

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O2

Llb_Grp_t * Llb_ManGroupCreateFromCuts(Llb_Man_t *pMan,Vec_Int_t *vCut1,Vec_Int_t *vCut2)

{
  Aig_Man_t *pAVar1;
  int iVar2;
  Llb_Grp_t *pGroup;
  Aig_Obj_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  
  pGroup = Llb_ManGroupAlloc(pMan);
  Aig_ManIncrementTravId(pMan->pAig);
  for (iVar5 = 0; iVar5 < vCut1->nSize; iVar5 = iVar5 + 1) {
    pAVar1 = pMan->pAig;
    iVar2 = Vec_IntEntry(vCut1,iVar5);
    pAVar3 = Aig_ManObj(pAVar1,iVar2);
    pAVar3->TravId = pMan->pAig->nTravIds;
  }
  for (iVar5 = 0; pAVar1 = pMan->pAig, iVar5 < vCut2->nSize; iVar5 = iVar5 + 1) {
    iVar2 = Vec_IntEntry(vCut2,iVar5);
    pAVar3 = Aig_ManObj(pAVar1,iVar2);
    if (pAVar3->TravId != pMan->pAig->nTravIds) {
      Vec_PtrPush(pGroup->vOuts,pAVar3);
    }
  }
  Aig_ManIncrementTravId(pAVar1);
  for (iVar5 = 0; iVar5 < vCut2->nSize; iVar5 = iVar5 + 1) {
    pAVar1 = pMan->pAig;
    iVar2 = Vec_IntEntry(vCut2,iVar5);
    pAVar3 = Aig_ManObj(pAVar1,iVar2);
    Llb_ManGroupMarkNodes_rec(pMan->pAig,pAVar3);
  }
  for (iVar5 = 0; iVar5 < vCut1->nSize; iVar5 = iVar5 + 1) {
    pAVar1 = pMan->pAig;
    iVar2 = Vec_IntEntry(vCut1,iVar5);
    pAVar3 = Aig_ManObj(pAVar1,iVar2);
    if (pAVar3->TravId == pMan->pAig->nTravIds) {
      Vec_PtrPush(pGroup->vIns,pAVar3);
    }
  }
  if (pGroup->vNodes == (Vec_Ptr_t *)0x0) {
    pVVar4 = Llb_ManGroupCollect(pGroup);
    pGroup->vNodes = pVVar4;
    return pGroup;
  }
  __assert_fail("p->vNodes == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Group.c"
                ,0x152,
                "Llb_Grp_t *Llb_ManGroupCreateFromCuts(Llb_Man_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

Llb_Grp_t * Llb_ManGroupCreateFromCuts( Llb_Man_t * pMan, Vec_Int_t * vCut1, Vec_Int_t * vCut2 )
{
    Llb_Grp_t * p;
    Aig_Obj_t * pObj;
    int i;
    p = Llb_ManGroupAlloc( pMan );

    // mark Cut1
    Aig_ManIncrementTravId( pMan->pAig );
    Aig_ManForEachObjVec( vCut1, pMan->pAig, pObj, i )
        Aig_ObjSetTravIdCurrent( pMan->pAig, pObj );
    // collect unmarked Cut2
    Aig_ManForEachObjVec( vCut2, pMan->pAig, pObj, i )
        if ( !Aig_ObjIsTravIdCurrent( pMan->pAig, pObj ) )
            Vec_PtrPush( p->vOuts, pObj );

    // mark nodes reachable from Cut2
    Aig_ManIncrementTravId( pMan->pAig );
    Aig_ManForEachObjVec( vCut2, pMan->pAig, pObj, i )
        Llb_ManGroupMarkNodes_rec( pMan->pAig, pObj );
    // collect marked Cut1
    Aig_ManForEachObjVec( vCut1, pMan->pAig, pObj, i )
        if ( Aig_ObjIsTravIdCurrent( pMan->pAig, pObj ) )
            Vec_PtrPush( p->vIns, pObj );

    // derive internal objects
    assert( p->vNodes == NULL );
    p->vNodes = Llb_ManGroupCollect( p );
    return p;
}